

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fverb.cpp
# Opt level: O1

void __thiscall Fverb::process(Fverb *this,float *in0,float *in1,float *out0,float *out1,uint count)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  int iVar13;
  _Head_base<0UL,_Fverb::BasicDsp_*,_false> _Var14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  int iVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  ulong uVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  uint uVar32;
  uint uVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  uint uVar40;
  float fVar41;
  float fVar42;
  uint uVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  
  _Var14._M_head_impl =
       (this->fDsp)._M_t.
       super___uniq_ptr_impl<Fverb::BasicDsp,_std::default_delete<Fverb::BasicDsp>_>._M_t.
       super__Tuple_impl<0UL,_Fverb::BasicDsp_*,_std::default_delete<Fverb::BasicDsp>_>.
       super__Head_base<0UL,_Fverb::BasicDsp_*,_false>._M_head_impl;
  fVar1 = *(float *)&_Var14._M_head_impl[2]._vptr_BasicDsp;
  fVar2 = *(float *)&_Var14._M_head_impl[3]._vptr_BasicDsp;
  fVar3 = *(float *)((long)(_Var14._M_head_impl + 2) + 4);
  fVar4 = *(float *)&_Var14._M_head_impl[5]._vptr_BasicDsp;
  fVar5 = *(float *)&_Var14._M_head_impl[0x10007]._vptr_BasicDsp;
  fVar6 = *(float *)((long)(_Var14._M_head_impl + 0x10007) + 4);
  fVar30 = *(float *)&_Var14._M_head_impl[0x10009]._vptr_BasicDsp;
  fVar28 = expf((*(float *)((long)(_Var14._M_head_impl + 0x10009) + 4) * -6.2831855 + 0.0) * fVar30)
  ;
  fVar29 = expf((*(float *)&_Var14._M_head_impl[0x1000c]._vptr_BasicDsp * -6.2831855 + 0.0) * fVar30
               );
  fVar7 = *(float *)((long)(_Var14._M_head_impl + 0x1000e) + 4);
  fVar8 = *(float *)&_Var14._M_head_impl[0x10413]._vptr_BasicDsp;
  fVar9 = *(float *)&_Var14._M_head_impl[0x11018]._vptr_BasicDsp;
  fVar10 = *(float *)((long)(_Var14._M_head_impl + 0x21019) + 4);
  fVar11 = *(float *)&_Var14._M_head_impl[0x2101b]._vptr_BasicDsp;
  fVar30 = expf((*(float *)(&DAT_00128120 + (long)_Var14._M_head_impl) * -6.2831855 + 0.0) * fVar30)
  ;
  if (0 < (int)count) {
    iVar13 = *(int *)((long)(_Var14._M_head_impl + 6) + 4);
    iVar17 = *(int *)&_Var14._M_head_impl[0x21022]._vptr_BasicDsp;
    iVar16 = *(int *)&_Var14._M_head_impl[0x54034]._vptr_BasicDsp;
    uVar20 = 0;
    iVar22 = *(int *)&_Var14._M_head_impl[0x21021]._vptr_BasicDsp;
    iVar19 = *(int *)&_Var14._M_head_impl[0x54033]._vptr_BasicDsp;
    do {
      uVar25 = iVar13 + (int)uVar20;
      fVar46 = *(float *)((long)(_Var14._M_head_impl + 3) + 4);
      fVar50 = *(float *)((long)(_Var14._M_head_impl + 4) + 4) * fVar46 + fVar3 * fVar1;
      *(float *)&_Var14._M_head_impl[4]._vptr_BasicDsp = fVar50;
      fVar51 = fVar50 + 0.15;
      fVar35 = *(float *)&_Var14._M_head_impl[6]._vptr_BasicDsp * fVar46 + fVar4 * fVar1;
      *(float *)((long)(_Var14._M_head_impl + 5) + 4) = fVar35;
      uVar23 = (ulong)(uVar25 & 0x1ffff);
      *(float *)((long)(_Var14._M_head_impl + 7) + uVar23 * 4) = in1[uVar20] * fVar35;
      fVar31 = *(float *)((long)(_Var14._M_head_impl + 0x10008) + 4) * fVar46 + fVar6 * fVar5;
      *(float *)&_Var14._M_head_impl[0x10008]._vptr_BasicDsp = fVar31;
      fVar12 = *(float *)((long)(_Var14._M_head_impl + 1) + 4);
      iVar18 = (int)(fVar31 * fVar12);
      if (iVar18 < 1) {
        iVar18 = 0;
      }
      if (0xffff < iVar18) {
        iVar18 = 0x10000;
      }
      fVar45 = *(float *)((long)(_Var14._M_head_impl + 0x1000a) + 4) * fVar46 + fVar28 * fVar2;
      *(float *)&_Var14._M_head_impl[0x1000a]._vptr_BasicDsp = fVar45;
      uVar24 = (ulong)(uVar25 - iVar18 & 0x1ffff);
      fVar36 = *(float *)((long)(_Var14._M_head_impl + 0x1000b) + 4) * fVar45 +
               *(float *)((long)(_Var14._M_head_impl + 7) + uVar24 * 4);
      *(float *)&_Var14._M_head_impl[0x1000b]._vptr_BasicDsp = fVar36;
      fVar39 = *(float *)&_Var14._M_head_impl[0x1000d]._vptr_BasicDsp * fVar46 + fVar29 * fVar2;
      *(float *)((long)(_Var14._M_head_impl + 0x1000c) + 4) = fVar39;
      fVar31 = *(float *)&_Var14._M_head_impl[0x1000e]._vptr_BasicDsp;
      fVar37 = fVar36 * (1.0 - fVar45) + fVar39 * fVar31;
      *(float *)((long)(_Var14._M_head_impl + 0x1000d) + 4) = fVar37;
      fVar34 = fVar39 + 1.0;
      fVar41 = fVar34 * -0.5 + 0.0;
      fVar44 = *(float *)((long)(_Var14._M_head_impl + 0x1000f) + 4) * fVar46 + fVar7 * fVar1;
      *(float *)&_Var14._M_head_impl[0x1000f]._vptr_BasicDsp = fVar44;
      fVar36 = *(float *)&_Var14._M_head_impl[0x10211]._vptr_BasicDsp;
      fVar37 = (fVar37 * fVar34 * 0.5 + fVar31 * fVar41) - fVar44 * fVar36;
      uVar26 = (ulong)(uVar25 & 0x3ff);
      *(float *)((long)(_Var14._M_head_impl + 0x10010) + uVar26 * 4) = fVar37;
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x10210) + 4) =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x10010) +
            (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x10210]._vptr_BasicDsp & 0x3ff) * 4);
      fVar31 = *(float *)((long)(_Var14._M_head_impl + 0x10412) + 4);
      fVar37 = (fVar37 * fVar44 + fVar36) - fVar44 * fVar31;
      *(float *)((long)(_Var14._M_head_impl + 0x10211) + 4U + uVar26 * 4) = fVar37;
      *(undefined4 *)&_Var14._M_head_impl[0x10412]._vptr_BasicDsp =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x10211) + 4U +
            (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x10411) + 4) & 0x3ff) * 4);
      fVar42 = *(float *)&_Var14._M_head_impl[0x10414]._vptr_BasicDsp * fVar46 + fVar8 * fVar1;
      *(float *)((long)(_Var14._M_head_impl + 0x10413) + 4) = fVar42;
      fVar36 = *(float *)((long)(_Var14._M_head_impl + 0x10c15) + 4);
      fVar37 = (fVar37 * fVar44 + fVar31) - fVar42 * fVar36;
      *(float *)((long)(_Var14._M_head_impl + 0x10414) + 4U + (ulong)(uVar25 & 0xfff) * 4) = fVar37;
      *(undefined4 *)&_Var14._M_head_impl[0x10c15]._vptr_BasicDsp =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x10414) + 4U +
            (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x10c14) + 4) & 0xfff) * 4);
      fVar31 = *(float *)&_Var14._M_head_impl[0x11017]._vptr_BasicDsp;
      fVar38 = (fVar37 * fVar42 + fVar36) - fVar42 * fVar31;
      *(float *)((long)(_Var14._M_head_impl + 0x10c16) + (ulong)(uVar25 & 0x7ff) * 4) = fVar38;
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x11016) + 4) =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x10c16) +
            (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x11016]._vptr_BasicDsp & 0x7ff) * 4);
      fVar37 = *(float *)&_Var14._M_head_impl[0x11019]._vptr_BasicDsp * fVar46 + fVar1 * fVar9;
      *(float *)((long)(_Var14._M_head_impl + 0x11018) + 4) = fVar37;
      fVar36 = *(float *)&_Var14._M_head_impl[0x21023]._vptr_BasicDsp;
      fVar31 = *(float *)((long)(_Var14._M_head_impl + 0x5a038) + 4U +
                         (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x11017) + 4) &
                                0x7fff) * 4) * fVar50 + fVar37 * fVar36 + fVar38 * fVar42 + fVar31;
      *(float *)((long)(_Var14._M_head_impl + 0x11019) + 4U + uVar23 * 4) = fVar31;
      fVar38 = *(float *)((long)(_Var14._M_head_impl + 0x2101a) + 4) * fVar46 + fVar5 * fVar10;
      *(float *)&_Var14._M_head_impl[0x2101a]._vptr_BasicDsp = fVar38;
      fVar47 = *(float *)&_Var14._M_head_impl[0x2101c]._vptr_BasicDsp * fVar46 + fVar11 * fVar2;
      *(float *)((long)(_Var14._M_head_impl + 0x2101b) + 4) = fVar47;
      fVar47 = fVar47 * *(float *)&_Var14._M_head_impl[0x10009]._vptr_BasicDsp +
               *(float *)&_Var14._M_head_impl[0x2101d]._vptr_BasicDsp;
      fVar47 = fVar47 - (float)(int)fVar47;
      *(float *)((long)(_Var14._M_head_impl + 0x2101c) + 4) = fVar47;
      iVar18 = (int)(((float)(&(anonymous_namespace)::ftbl0mydspSIG0)
                             [(int)(((0.25 - (float)(int)(fVar47 + 0.25)) + fVar47) * 65536.0)] *
                      fVar38 + 0.030509727) * fVar12) + -1;
      uVar40 = *(uint *)&_Var14._M_head_impl[0x2101e]._vptr_BasicDsp;
      uVar32 = uVar40;
      if (iVar18 == iVar17) {
        uVar32 = 0;
      }
      fVar48 = *(float *)&_Var14._M_head_impl[0x21020]._vptr_BasicDsp;
      uVar43 = *(uint *)((long)(_Var14._M_head_impl + 0x2101d) + 4);
      uVar32 = -(uint)(fVar48 == 1.0) & uVar32;
      iVar15 = iVar22;
      if (iVar18 != iVar17) {
        iVar15 = iVar18;
      }
      if (fVar48 < 1.0) {
        iVar15 = iVar22;
      }
      uVar33 = uVar43;
      if (iVar18 == iVar22) {
        uVar33 = uVar32;
      }
      uVar27 = -(uint)(*(float *)&_Var14._M_head_impl[0x2101f]._vptr_BasicDsp != 0.0);
      fVar49 = (float)(uVar27 & -(uint)(fVar48 < 1.0) &
                                (uint)*(float *)&_Var14._M_head_impl[0x2101f]._vptr_BasicDsp &
                                -(uint)(0.0 < fVar48) |
                      ~uVar27 & (~-(uint)(fVar48 == 0.0) & uVar32 | uVar33 & -(uint)(fVar48 == 0.0))
                      );
      *(float *)((long)(_Var14._M_head_impl + 0x2101e) + 4) = fVar49;
      fVar49 = fVar49 + fVar48;
      if (1.0 <= fVar49) {
        fVar49 = 1.0;
      }
      if (fVar49 <= 0.0) {
        fVar49 = 0.0;
      }
      *(float *)((long)(_Var14._M_head_impl + 0x2101f) + 4) = fVar49;
      if (iVar18 == iVar22) {
        iVar18 = iVar17;
      }
      if (fVar48 <= 0.0) {
        iVar17 = iVar18;
      }
      iVar22 = iVar15;
      if (0xffff < iVar15) {
        iVar22 = 0x10000;
      }
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      fVar48 = *(float *)((long)(_Var14._M_head_impl + 0x11019) + 4U +
                         (ulong)(uVar25 - iVar22 & 0x1ffff) * 4);
      iVar22 = iVar17;
      if (0xffff < iVar17) {
        iVar22 = 0x10000;
      }
      if (fVar51 <= 0.25) {
        fVar51 = 0.25;
      }
      if (0.5 <= fVar51) {
        fVar51 = 0.5;
      }
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      *(float *)((long)(_Var14._M_head_impl + 0x21022) + 4) =
           fVar49 * (*(float *)((long)(_Var14._M_head_impl + 0x11019) + 4U +
                               (ulong)(uVar25 - iVar22 & 0x1ffff) * 4) - fVar48) + fVar48;
      fVar36 = fVar36 + (0.0 - fVar31 * fVar37);
      uVar21 = (ulong)(uVar25 & 0x7fff);
      *(float *)((long)(_Var14._M_head_impl + 0x21023) + 4U + uVar21 * 4) = fVar36;
      fVar48 = fVar46 * *(float *)(&DAT_00128128 + (long)_Var14._M_head_impl) + fVar30 * fVar2;
      *(float *)(&DAT_00128124 + (long)_Var14._M_head_impl) = fVar48;
      fVar31 = *(float *)(&DAT_00128130 + (long)_Var14._M_head_impl) * fVar48 +
               *(float *)((long)(_Var14._M_head_impl + 0x21023) + 4U +
                         (ulong)(uVar25 - *(int *)(&DAT_0012811c + (long)_Var14._M_head_impl) &
                                0x7fff) * 4);
      *(float *)(&DAT_0012812c + (long)_Var14._M_head_impl) = fVar31;
      fVar49 = 1.0 - fVar48;
      fVar46 = *(float *)(&DAT_0014813c + (long)_Var14._M_head_impl);
      fVar52 = fVar51 * fVar46 + fVar50 * fVar31 * fVar49;
      *(float *)(&DAT_00128134 + (long)&(_Var14._M_head_impl)->_vptr_BasicDsp + uVar21 * 4) = fVar52
      ;
      *(undefined4 *)(&DAT_00148138 + (long)_Var14._M_head_impl) =
           *(undefined4 *)
            (&DAT_00128134 +
            (long)&(_Var14._M_head_impl)->_vptr_BasicDsp +
            (ulong)(uVar25 - *(int *)(&DAT_00148134 + (long)_Var14._M_head_impl) & 0x7fff) * 4);
      *(float *)(&DAT_00148140 + (long)&(_Var14._M_head_impl)->_vptr_BasicDsp + uVar21 * 4) =
           (0.0 - fVar52 * fVar51) + fVar46;
      *(float *)((long)(_Var14._M_head_impl + 0x2d028) + (ulong)(uVar25 & 0x3fff) * 4) =
           fVar31 * fVar49;
      *(float *)((long)(_Var14._M_head_impl + 0x2f028) + uVar21 * 4) = fVar36;
      *(float *)((long)(_Var14._M_head_impl + 0x33028) + uVar23 * 4) = fVar35 * in0[uVar20];
      fVar46 = fVar45 * *(float *)((long)(_Var14._M_head_impl + 0x43028) + 4) +
               *(float *)((long)(_Var14._M_head_impl + 0x33028) + uVar24 * 4);
      *(float *)&_Var14._M_head_impl[0x43028]._vptr_BasicDsp = fVar46;
      fVar31 = (1.0 - fVar45) * fVar46 +
               fVar39 * *(float *)((long)(_Var14._M_head_impl + 0x43029) + 4);
      *(float *)&_Var14._M_head_impl[0x43029]._vptr_BasicDsp = fVar31;
      fVar46 = *(float *)&_Var14._M_head_impl[0x4322b]._vptr_BasicDsp;
      fVar35 = (fVar34 * fVar31 * 0.5 +
               fVar41 * *(float *)((long)(_Var14._M_head_impl + 0x43029) + 4)) - fVar44 * fVar46;
      *(float *)((long)(_Var14._M_head_impl + 0x4302a) + uVar26 * 4) = fVar35;
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x4322a) + 4) =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x4302a) +
            (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x4322a]._vptr_BasicDsp & 0x3ff) * 4);
      fVar31 = *(float *)((long)(_Var14._M_head_impl + 0x4342c) + 4);
      fVar35 = (fVar35 * fVar44 + fVar46) - fVar44 * fVar31;
      *(float *)((long)(_Var14._M_head_impl + 0x4322b) + 4U + uVar26 * 4) = fVar35;
      *(undefined4 *)&_Var14._M_head_impl[0x4342c]._vptr_BasicDsp =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x4322b) + 4U +
            (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x4342b) + 4) & 0x3ff) * 4);
      fVar46 = *(float *)&_Var14._M_head_impl[0x43c2e]._vptr_BasicDsp;
      fVar35 = (fVar35 * fVar44 + fVar31) - fVar42 * fVar46;
      *(float *)((long)(_Var14._M_head_impl + 0x4342d) + (ulong)(uVar25 & 0xfff) * 4) = fVar35;
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x43c2d) + 4) =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x4342d) +
            (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x43c2d]._vptr_BasicDsp & 0xfff) * 4);
      fVar31 = *(float *)((long)(_Var14._M_head_impl + 0x4402f) + 4);
      fVar35 = (fVar35 * fVar42 + fVar46) - fVar42 * fVar31;
      *(float *)((long)(_Var14._M_head_impl + 0x43c2e) + 4U + (ulong)(uVar25 & 0x7ff) * 4) = fVar35;
      *(undefined4 *)&_Var14._M_head_impl[0x4402f]._vptr_BasicDsp =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x43c2e) + 4U +
            (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x4402e) + 4) & 0x7ff) * 4);
      fVar46 = *(float *)&_Var14._M_head_impl[0x54035]._vptr_BasicDsp;
      fVar31 = *(float *)(&DAT_00148140 +
                         (long)&(_Var14._M_head_impl)->_vptr_BasicDsp +
                         (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x44030]._vptr_BasicDsp &
                                0x7fff) * 4) * fVar50 + fVar37 * fVar46 + fVar35 * fVar42 + fVar31;
      *(float *)((long)(_Var14._M_head_impl + 0x44030) + 4U + uVar23 * 4) = fVar31;
      iVar22 = (int)(fVar12 * (fVar38 * (float)(&(anonymous_namespace)::ftbl0mydspSIG0)
                                               [(int)(fVar47 * 65536.0)] + 0.025603978)) + -1;
      if (iVar22 == iVar16) {
        uVar40 = 0;
      }
      fVar12 = *(float *)&_Var14._M_head_impl[0x54032]._vptr_BasicDsp;
      iVar18 = iVar19;
      if (iVar22 != iVar16) {
        iVar18 = iVar22;
      }
      uVar40 = -(uint)(fVar12 == 1.0) & uVar40;
      if (fVar12 < 1.0) {
        iVar18 = iVar19;
      }
      if (iVar22 == iVar19) {
        uVar43 = uVar40;
      }
      uVar32 = -(uint)(*(float *)&_Var14._M_head_impl[0x54031]._vptr_BasicDsp != 0.0);
      fVar35 = (float)(uVar32 & -(uint)(fVar12 < 1.0) &
                                (uint)*(float *)&_Var14._M_head_impl[0x54031]._vptr_BasicDsp &
                                -(uint)(0.0 < fVar12) |
                      ~uVar32 & (~-(uint)(fVar12 == 0.0) & uVar40 | uVar43 & -(uint)(fVar12 == 0.0))
                      );
      *(float *)((long)(_Var14._M_head_impl + 0x54030) + 4) = fVar35;
      fVar35 = fVar35 + fVar12;
      if (1.0 <= fVar35) {
        fVar35 = 1.0;
      }
      if (fVar35 <= 0.0) {
        fVar35 = 0.0;
      }
      *(float *)((long)(_Var14._M_head_impl + 0x54031) + 4) = fVar35;
      if (iVar22 == iVar19) {
        iVar22 = iVar16;
      }
      if (fVar12 <= 0.0) {
        iVar16 = iVar22;
      }
      iVar22 = iVar18;
      if (0xffff < iVar18) {
        iVar22 = 0x10000;
      }
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      fVar12 = *(float *)((long)(_Var14._M_head_impl + 0x44030) + 4U +
                         (ulong)(uVar25 - iVar22 & 0x1ffff) * 4);
      iVar22 = iVar16;
      if (0xffff < iVar16) {
        iVar22 = 0x10000;
      }
      if (iVar22 < 1) {
        iVar22 = 0;
      }
      *(float *)((long)(_Var14._M_head_impl + 0x54034) + 4) =
           fVar35 * (*(float *)((long)(_Var14._M_head_impl + 0x44030) + 4U +
                               (ulong)(uVar25 - iVar22 & 0x1ffff) * 4) - fVar12) + fVar12;
      fVar46 = fVar46 + (0.0 - fVar37 * fVar31);
      *(float *)((long)(_Var14._M_head_impl + 0x54035) + 4U + uVar21 * 4) = fVar46;
      fVar35 = fVar48 * *(float *)((long)(_Var14._M_head_impl + 0x58036) + 4) +
               *(float *)((long)(_Var14._M_head_impl + 0x54035) + 4U +
                         (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x58035) + 4) &
                                0x7fff) * 4);
      *(float *)&_Var14._M_head_impl[0x58036]._vptr_BasicDsp = fVar35;
      fVar12 = *(float *)&_Var14._M_head_impl[0x5a038]._vptr_BasicDsp;
      fVar31 = fVar51 * fVar12 + fVar50 * fVar49 * fVar35;
      *(float *)((long)(_Var14._M_head_impl + 0x58037) + (ulong)(uVar25 & 0x3fff) * 4) = fVar31;
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x5a037) + 4) =
           *(undefined4 *)
            ((long)(_Var14._M_head_impl + 0x58037) +
            (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x5a037]._vptr_BasicDsp & 0x3fff) * 4);
      *(float *)((long)(_Var14._M_head_impl + 0x5a038) + 4U + uVar21 * 4) =
           (0.0 - fVar31 * fVar51) + fVar12;
      *(float *)((long)(_Var14._M_head_impl + 0x5e038) + 4U + (ulong)(uVar25 & 0x1fff) * 4) =
           fVar35 * fVar49;
      *(float *)((long)(_Var14._M_head_impl + 0x5f038) + 4U + uVar21 * 4) = fVar46;
      out0[uVar20] = ((*(float *)((long)(_Var14._M_head_impl + 0x2f028) +
                                 (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x63038) + 4
                                                          ) & 0x7fff) * 4) +
                       *(float *)((long)(_Var14._M_head_impl + 0x2f028) +
                                 (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x63039].
                                                           _vptr_BasicDsp & 0x7fff) * 4) +
                      *(float *)(&DAT_00148140 +
                                (long)&(_Var14._M_head_impl)->_vptr_BasicDsp +
                                (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x63039) + 4)
                                       & 0x7fff) * 4)) -
                     (*(float *)((long)(_Var14._M_head_impl + 0x2d028) +
                                (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x6303a].
                                                          _vptr_BasicDsp & 0x3fff) * 4) +
                      *(float *)((long)(_Var14._M_head_impl + 0x5f038) + 4U +
                                (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x6303a) + 4)
                                       & 0x7fff) * 4) +
                      *(float *)((long)(_Var14._M_head_impl + 0x5e038) + 4U +
                                (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x6303b].
                                                          _vptr_BasicDsp & 0x1fff) * 4) +
                     *(float *)((long)(_Var14._M_head_impl + 0x5a038) + 4U +
                               (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x6303b) + 4)
                                      & 0x7fff) * 4))) * 0.6;
      out1[uVar20] = ((*(float *)((long)(_Var14._M_head_impl + 0x5f038) + 4U +
                                 (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x6303c].
                                                           _vptr_BasicDsp & 0x7fff) * 4) +
                       *(float *)((long)(_Var14._M_head_impl + 0x5f038) + 4U +
                                 (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x6303c) + 4
                                                          ) & 0x7fff) * 4) +
                      *(float *)((long)(_Var14._M_head_impl + 0x5a038) + 4U +
                                (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x6303d].
                                                          _vptr_BasicDsp & 0x7fff) * 4)) -
                     (*(float *)((long)(_Var14._M_head_impl + 0x5e038) + 4U +
                                (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x6303d) + 4)
                                       & 0x1fff) * 4) +
                      *(float *)((long)(_Var14._M_head_impl + 0x2f028) +
                                (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x6303e].
                                                          _vptr_BasicDsp & 0x7fff) * 4) +
                      *(float *)((long)(_Var14._M_head_impl + 0x2d028) +
                                (ulong)(uVar25 - *(int *)((long)(_Var14._M_head_impl + 0x6303e) + 4)
                                       & 0x3fff) * 4) +
                     *(float *)(&DAT_00148140 +
                               (long)&(_Var14._M_head_impl)->_vptr_BasicDsp +
                               (ulong)(uVar25 - *(int *)&_Var14._M_head_impl[0x6303f]._vptr_BasicDsp
                                      & 0x7fff) * 4))) * 0.6;
      *(undefined4 *)((long)(_Var14._M_head_impl + 4) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[4]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[6]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 5) + 4);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x10008) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x10008]._vptr_BasicDsp;
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000a) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x1000a]._vptr_BasicDsp;
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000b) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x1000b]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x1000d]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000c) + 4);
      *(undefined4 *)&_Var14._M_head_impl[0x1000e]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000d) + 4);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x1000f) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x1000f]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x10211]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x10210) + 4);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x10412) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x10412]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x10414]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x10413) + 4);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x10c15) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x10c15]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x11017]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x11016) + 4);
      *(undefined4 *)&_Var14._M_head_impl[0x11019]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x11018) + 4);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101a) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x2101a]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x2101c]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101b) + 4);
      *(undefined4 *)&_Var14._M_head_impl[0x2101d]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101c) + 4);
      *(undefined4 *)&_Var14._M_head_impl[0x2101f]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101e) + 4);
      *(undefined4 *)&_Var14._M_head_impl[0x21020]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x2101f) + 4);
      *(undefined4 *)&_Var14._M_head_impl[0x21023]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x21022) + 4);
      *(undefined4 *)(&DAT_00128128 + (long)_Var14._M_head_impl) =
           *(undefined4 *)(&DAT_00128124 + (long)_Var14._M_head_impl);
      *(undefined4 *)(&DAT_00128130 + (long)_Var14._M_head_impl) =
           *(undefined4 *)(&DAT_0012812c + (long)_Var14._M_head_impl);
      *(undefined4 *)(&DAT_0014813c + (long)_Var14._M_head_impl) =
           *(undefined4 *)(&DAT_00148138 + (long)_Var14._M_head_impl);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x43028) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x43028]._vptr_BasicDsp;
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x43029) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x43029]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x4322b]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x4322a) + 4);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x4342c) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x4342c]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x43c2e]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x43c2d) + 4);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x4402f) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x4402f]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x54031]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x54030) + 4);
      *(undefined4 *)&_Var14._M_head_impl[0x54032]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x54031) + 4);
      *(undefined4 *)&_Var14._M_head_impl[0x54035]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x54034) + 4);
      *(undefined4 *)((long)(_Var14._M_head_impl + 0x58036) + 4) =
           *(undefined4 *)&_Var14._M_head_impl[0x58036]._vptr_BasicDsp;
      *(undefined4 *)&_Var14._M_head_impl[0x5a038]._vptr_BasicDsp =
           *(undefined4 *)((long)(_Var14._M_head_impl + 0x5a037) + 4);
      uVar20 = uVar20 + 1;
      iVar22 = iVar15;
      iVar19 = iVar18;
    } while (count != uVar20);
    *(int *)((long)(_Var14._M_head_impl + 6) + 4) = iVar13 + (int)uVar20;
    *(int *)&_Var14._M_head_impl[0x21022]._vptr_BasicDsp = iVar17;
    *(int *)&_Var14._M_head_impl[0x21021]._vptr_BasicDsp = iVar15;
    *(int *)((long)(_Var14._M_head_impl + 0x21020) + 4) = iVar15;
    *(int *)((long)(_Var14._M_head_impl + 0x21021) + 4) = iVar17;
    *(int *)&_Var14._M_head_impl[0x54034]._vptr_BasicDsp = iVar16;
    *(int *)&_Var14._M_head_impl[0x54033]._vptr_BasicDsp = iVar18;
    *(int *)((long)(_Var14._M_head_impl + 0x54032) + 4) = iVar18;
    *(int *)((long)(_Var14._M_head_impl + 0x54033) + 4) = iVar16;
  }
  return;
}

Assistant:

void Fverb::process(const float *in0, const float *in1, float *out0,
                    float *out1, unsigned count) noexcept
{

    mydsp &dsp = static_cast<mydsp &>(*fDsp);
    float *inputs[] = {
        const_cast<float *>(in0),
        const_cast<float *>(in1),
    };
    float *outputs[] = {
        out0,
        out1,
    };
    dsp.compute(count, inputs, outputs);
}